

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O3

ParseStatus StoreFrame(int frame_num,uint32_t min_size,MemBuffer *mem,Frame *frame)

{
  size_t data_size;
  size_t sVar1;
  int iVar2;
  uint uVar3;
  uint8_t *puVar4;
  byte bVar5;
  bool bVar6;
  bool bVar7;
  VP8StatusCode VVar8;
  size_t sVar9;
  ulong uVar10;
  size_t sVar11;
  ulong uVar12;
  ParseStatus PVar13;
  ulong uVar14;
  WebPBitstreamFeatures features;
  WebPBitstreamFeatures local_58;
  
  sVar11 = mem->start_;
  sVar9 = mem->end_;
  PVar13 = PARSE_NEED_MORE_DATA;
  if ((ulong)min_size <= sVar9 - sVar11 && 7 < sVar9 - sVar11) {
    bVar6 = false;
    bVar7 = false;
    while( true ) {
      puVar4 = mem->buf_;
      iVar2 = *(int *)(puVar4 + sVar11);
      mem->start_ = sVar11 + 4;
      uVar3 = *(uint *)(puVar4 + sVar11 + 4);
      sVar1 = sVar11 + 8;
      mem->start_ = sVar1;
      PVar13 = PARSE_ERROR;
      if (0xfffffff6 < uVar3) break;
      uVar14 = (ulong)((uVar3 & 1) + uVar3);
      uVar12 = sVar9 - sVar1;
      uVar10 = uVar14;
      if (uVar12 < uVar14) {
        uVar10 = uVar12;
      }
      sVar9 = mem->riff_end_;
      if (sVar9 - sVar1 < uVar14) {
        return PARSE_ERROR;
      }
      data_size = uVar10 + 8;
      if (iVar2 == 0x20385056) {
LAB_001072a0:
        if (!bVar6) {
          VVar8 = WebPGetFeaturesInternal(puVar4 + sVar11,data_size,&local_58,0x209);
          if ((uVar12 < uVar14) && (VVar8 == VP8_STATUS_NOT_ENOUGH_DATA)) {
            return PARSE_NEED_MORE_DATA;
          }
          if (VVar8 != VP8_STATUS_OK) {
            return PARSE_ERROR;
          }
          frame->img_components_[0].offset_ = sVar11;
          frame->img_components_[0].size_ = data_size;
          frame->width_ = local_58.width;
          frame->height_ = local_58.height;
          frame->has_alpha_ = frame->has_alpha_ | local_58.has_alpha;
          frame->frame_num_ = frame_num;
          frame->complete_ = (uint)(uVar14 <= uVar12);
          sVar11 = uVar10 + mem->start_;
          mem->start_ = sVar11;
          sVar9 = mem->riff_end_;
          bVar6 = true;
          goto LAB_0010732c;
        }
LAB_001072a5:
        mem->start_ = sVar11;
        bVar5 = 0;
      }
      else {
        if (iVar2 == 0x4c385056) {
          if (bVar7) {
            return PARSE_ERROR;
          }
          goto LAB_001072a0;
        }
        if ((iVar2 != 0x48504c41) || (bVar7)) goto LAB_001072a5;
        frame->img_components_[1].offset_ = sVar11;
        frame->img_components_[1].size_ = data_size;
        frame->has_alpha_ = 1;
        frame->frame_num_ = frame_num;
        sVar11 = uVar10 + sVar1;
        mem->start_ = sVar11;
        bVar7 = true;
LAB_0010732c:
        bVar5 = 1;
      }
      PVar13 = (ParseStatus)(uVar12 < uVar14);
      if (sVar11 == sVar9) {
        return (uint)(uVar12 < uVar14);
      }
      sVar9 = mem->end_;
      if (sVar9 - sVar11 < 8) {
        PVar13 = PARSE_NEED_MORE_DATA;
      }
      if (!(bool)(bVar5 & PVar13 == PARSE_OK)) {
        return PVar13;
      }
    }
  }
  return PVar13;
}

Assistant:

static ParseStatus StoreFrame(int frame_num, uint32_t min_size,
                              MemBuffer* const mem, Frame* const frame) {
  int alpha_chunks = 0;
  int image_chunks = 0;
  int done = (MemDataSize(mem) < CHUNK_HEADER_SIZE ||
              MemDataSize(mem) < min_size);
  ParseStatus status = PARSE_OK;

  if (done) return PARSE_NEED_MORE_DATA;

  do {
    const size_t chunk_start_offset = mem->start_;
    const uint32_t fourcc = ReadLE32(mem);
    const uint32_t payload_size = ReadLE32(mem);
    uint32_t payload_size_padded;
    size_t payload_available;
    size_t chunk_size;

    if (payload_size > MAX_CHUNK_PAYLOAD) return PARSE_ERROR;

    payload_size_padded = payload_size + (payload_size & 1);
    payload_available = (payload_size_padded > MemDataSize(mem))
                      ? MemDataSize(mem) : payload_size_padded;
    chunk_size = CHUNK_HEADER_SIZE + payload_available;
    if (SizeIsInvalid(mem, payload_size_padded)) return PARSE_ERROR;
    if (payload_size_padded > MemDataSize(mem)) status = PARSE_NEED_MORE_DATA;

    switch (fourcc) {
      case MKFOURCC('A', 'L', 'P', 'H'):
        if (alpha_chunks == 0) {
          ++alpha_chunks;
          frame->img_components_[1].offset_ = chunk_start_offset;
          frame->img_components_[1].size_ = chunk_size;
          frame->has_alpha_ = 1;
          frame->frame_num_ = frame_num;
          Skip(mem, payload_available);
        } else {
          goto Done;
        }
        break;
      case MKFOURCC('V', 'P', '8', 'L'):
        if (alpha_chunks > 0) return PARSE_ERROR;  // VP8L has its own alpha
        // fall through
      case MKFOURCC('V', 'P', '8', ' '):
        if (image_chunks == 0) {
          // Extract the bitstream features, tolerating failures when the data
          // is incomplete.
          WebPBitstreamFeatures features;
          const VP8StatusCode vp8_status =
              WebPGetFeatures(mem->buf_ + chunk_start_offset, chunk_size,
                              &features);
          if (status == PARSE_NEED_MORE_DATA &&
              vp8_status == VP8_STATUS_NOT_ENOUGH_DATA) {
            return PARSE_NEED_MORE_DATA;
          } else if (vp8_status != VP8_STATUS_OK) {
            // We have enough data, and yet WebPGetFeatures() failed.
            return PARSE_ERROR;
          }
          ++image_chunks;
          SetFrameInfo(chunk_start_offset, chunk_size, frame_num,
                       status == PARSE_OK, &features, frame);
          Skip(mem, payload_available);
        } else {
          goto Done;
        }
        break;
 Done:
      default:
        // Restore fourcc/size when moving up one level in parsing.
        Rewind(mem, CHUNK_HEADER_SIZE);
        done = 1;
        break;
    }

    if (mem->start_ == mem->riff_end_) {
      done = 1;
    } else if (MemDataSize(mem) < CHUNK_HEADER_SIZE) {
      status = PARSE_NEED_MORE_DATA;
    }
  } while (!done && status == PARSE_OK);

  return status;
}